

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolyConnectivity.hh
# Opt level: O1

void __thiscall OpenMesh::PolyConnectivity::~PolyConnectivity(PolyConnectivity *this)

{
  pointer ppVar1;
  pointer pAVar2;
  
  (this->super_ArrayKernel).super_BaseKernel._vptr_BaseKernel =
       (_func_int **)&PTR__PolyConnectivity_001c2570;
  ppVar1 = (this->next_cache_).
           super__Vector_base<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>,_std::allocator<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (ppVar1 != (pointer)0x0) {
    operator_delete(ppVar1);
  }
  pAVar2 = (this->edgeData_).
           super__Vector_base<OpenMesh::PolyConnectivity::AddFaceEdgeInfo,_std::allocator<OpenMesh::PolyConnectivity::AddFaceEdgeInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pAVar2 != (pointer)0x0) {
    operator_delete(pAVar2);
  }
  ArrayKernel::~ArrayKernel(&this->super_ArrayKernel);
  return;
}

Assistant:

virtual ~PolyConnectivity() {}